

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallExpression.cpp
# Opt level: O0

Expression *
slang::ast::CallExpression::fromBuiltInMethod
          (Compilation *compilation,SymbolKind rootKind,Expression *expr,string_view methodName,
          InvocationExpressionSyntax *syntax,ArrayOrRandomizeMethodExpressionSyntax *withClause,
          ASTContext *context)

{
  string_view name;
  SystemSubroutine *pSVar1;
  SyntaxNode *in_RCX;
  undefined8 in_RDX;
  undefined4 in_ESI;
  Compilation *in_R9;
  SystemSubroutine *subroutine;
  ASTContext *in_stack_00000768;
  ArrayOrRandomizeMethodExpressionSyntax *in_stack_00000770;
  InvocationExpressionSyntax *in_stack_00000778;
  Expression *in_stack_00000780;
  SystemSubroutine *in_stack_00000788;
  Compilation *in_stack_00000790;
  SourceRange in_stack_000008e0;
  Scope *in_stack_000008f0;
  undefined8 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffd8;
  Expression *local_8;
  
  name._M_str._0_4_ = in_stack_ffffffffffffffd8;
  name._M_len = in_RDX;
  name._M_str._4_4_ = in_ESI;
  pSVar1 = Compilation::getSystemMethod
                     (in_R9,(SymbolKind)((ulong)in_stack_ffffffffffffffc0 >> 0x20),name);
  if (pSVar1 == (SystemSubroutine *)0x0) {
    local_8 = (Expression *)0x0;
  }
  else {
    if (in_R9 != (Compilation *)0x0) {
      slang::syntax::SyntaxNode::sourceRange(in_RCX);
    }
    local_8 = createSystemCall(in_stack_00000790,in_stack_00000788,in_stack_00000780,
                               in_stack_00000778,in_stack_00000770,in_stack_000008e0,
                               in_stack_00000768,in_stack_000008f0);
  }
  return local_8;
}

Assistant:

Expression* CallExpression::fromBuiltInMethod(
    Compilation& compilation, SymbolKind rootKind, const Expression& expr,
    std::string_view methodName, const InvocationExpressionSyntax* syntax,
    const ArrayOrRandomizeMethodExpressionSyntax* withClause, const ASTContext& context) {

    auto subroutine = compilation.getSystemMethod(rootKind, methodName);
    if (!subroutine)
        return nullptr;

    return &createSystemCall(compilation, *subroutine, &expr, syntax, withClause,
                             syntax ? syntax->sourceRange() : expr.sourceRange, context);
}